

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scheme.cpp
# Opt level: O0

void implementations::scheme::repl(string *prompt,env_p *env)

{
  ostream *poVar1;
  size_t __nbytes;
  cell *exp;
  shared_ptr<implementations::scheme::environment> local_128;
  cell local_118;
  cell local_c0;
  string local_68;
  string local_38 [8];
  string line;
  env_p *env_local;
  string *prompt_local;
  
  line.field_2._8_8_ = env;
  do {
    std::operator<<((ostream *)&std::cout,(string *)prompt);
    std::__cxx11::string::string(local_38);
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&std::cin,local_38);
    read((int)&local_118,local_38,__nbytes);
    std::shared_ptr<implementations::scheme::environment>::shared_ptr(&local_128,env);
    eval(&local_c0,&local_118,&local_128);
    to_string_abi_cxx11_(&local_68,(scheme *)&local_c0,exp);
    poVar1 = std::operator<<((ostream *)&std::cout,(string *)&local_68);
    std::operator<<(poVar1,'\n');
    std::__cxx11::string::~string((string *)&local_68);
    cell::~cell(&local_c0);
    std::shared_ptr<implementations::scheme::environment>::~shared_ptr(&local_128);
    cell::~cell(&local_118);
    std::__cxx11::string::~string(local_38);
  } while( true );
}

Assistant:

void repl(const std::string & prompt, env_p env)
{
	for (;;) {
		std::cout << prompt;
		std::string line; std::getline(std::cin, line);
		std::cout << to_string(eval(read(line), env)) << '\n';
	}
}